

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operhlp.c
# Opt level: O1

CURLcode add_file_name_to_url(CURL *curl,char **inurlp,char *filename)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  void *__ptr;
  CURLcode CVar7;
  bool bVar8;
  char *pcVar9;
  char *path;
  char *newurl;
  char *query;
  char *local_48;
  char *local_40;
  long local_38;
  
  lVar2 = curl_url();
  local_48 = (char *)0x0;
  local_38 = 0;
  if (lVar2 == 0) {
    CVar7 = CURLE_URL_MALFORMAT;
    goto LAB_0011aff2;
  }
  iVar1 = curl_url_set(lVar2,0,*inurlp,0x208);
  bVar8 = false;
  CVar7 = CURLE_OUT_OF_MEMORY;
  switch(iVar1) {
  case 0:
    iVar1 = curl_url_get(lVar2,7,&local_48,0);
    switch(iVar1) {
    case 0:
      iVar1 = curl_url_get(lVar2,8,&local_38,0);
      if (local_38 != 0 && iVar1 == 0) {
        curl_free();
        curl_free(local_48);
        curl_url_cleanup(lVar2);
        CVar7 = CURLE_URL_MALFORMAT;
        bVar8 = true;
        break;
      }
      pcVar3 = strrchr(local_48,0x2f);
      if (pcVar3 != (char *)0x0) {
        bVar8 = false;
        CVar7 = CURLE_OK;
        if (pcVar3[1] != '\0') break;
      }
      pcVar4 = strrchr(filename,0x2f);
      pcVar9 = pcVar4 + 1;
      if (pcVar4 == (char *)0x0) {
        pcVar9 = filename;
        pcVar4 = filename;
      }
      pcVar5 = strrchr(pcVar4,0x5c);
      pcVar4 = pcVar5 + 1;
      if (pcVar5 == (char *)0x0) {
        pcVar4 = pcVar9;
      }
      lVar6 = curl_easy_escape(curl,pcVar4,0);
      if (lVar6 == 0) goto switchD_0011ae0b_caseD_2;
      pcVar4 = "%s%s";
      if (pcVar3 == (char *)0x0) {
        pcVar4 = "%s/%s";
      }
      __ptr = (void *)curl_maprintf(pcVar4,local_48,lVar6);
      curl_free(lVar6);
      CVar7 = CURLE_URL_MALFORMAT;
      bVar8 = false;
      if (__ptr == (void *)0x0) break;
      iVar1 = curl_url_set(lVar2,7,__ptr,0);
      free(__ptr);
      switch(iVar1) {
      case 0:
        iVar1 = curl_url_get(lVar2,0,&local_40,4);
        switch(iVar1) {
        case 0:
          free(*inurlp);
          *inurlp = local_40;
          bVar8 = false;
          CVar7 = CURLE_OK;
          break;
        case 1:
          goto switchD_0011ae0b_caseD_1;
        case 2:
        case 3:
        case 4:
        case 6:
          break;
        case 5:
          goto switchD_0011ae0b_caseD_5;
        case 7:
          goto switchD_0011af95_caseD_7;
        default:
          if (iVar1 == 0x1e) goto LAB_0011ae9c;
        }
        break;
      case 1:
        goto switchD_0011ae0b_caseD_1;
      case 2:
      case 3:
      case 4:
      case 6:
        break;
      case 5:
        goto switchD_0011ae0b_caseD_5;
      case 7:
switchD_0011af95_caseD_7:
        CVar7 = CURLE_OUT_OF_MEMORY;
        break;
      default:
        if (iVar1 != 0x1e) break;
        goto LAB_0011ae9c;
      }
      break;
    case 1:
      goto switchD_0011ae0b_caseD_1;
    case 2:
    case 3:
    case 4:
    case 6:
      goto switchD_0011ae0b_caseD_2;
    case 5:
      goto switchD_0011ae0b_caseD_5;
    case 7:
      break;
    default:
      goto switchD_0011ae0b_default;
    }
    break;
  case 1:
switchD_0011ae0b_caseD_1:
    bVar8 = false;
    CVar7 = CURLE_BAD_FUNCTION_ARGUMENT;
    break;
  case 2:
  case 3:
  case 4:
  case 6:
switchD_0011ae0b_caseD_2:
    bVar8 = false;
    CVar7 = CURLE_URL_MALFORMAT;
    break;
  case 5:
switchD_0011ae0b_caseD_5:
    bVar8 = false;
    CVar7 = CURLE_UNSUPPORTED_PROTOCOL;
    break;
  case 7:
    break;
  default:
switchD_0011ae0b_default:
    if (iVar1 != 0x1e) goto switchD_0011ae0b_caseD_2;
LAB_0011ae9c:
    bVar8 = false;
    CVar7 = CURLE_NOT_BUILT_IN;
  }
  if (bVar8) {
    return CURLE_OK;
  }
LAB_0011aff2:
  curl_url_cleanup(lVar2);
  curl_free(local_48);
  return CVar7;
}

Assistant:

CURLcode add_file_name_to_url(CURL *curl, char **inurlp, const char *filename)
{
  CURLcode result = CURLE_URL_MALFORMAT;
  CURLUcode uerr;
  CURLU *uh = curl_url();
  char *path = NULL;
  char *query = NULL;
  if(uh) {
    char *ptr;
    uerr = curl_url_set(uh, CURLUPART_URL, *inurlp,
                    CURLU_GUESS_SCHEME|CURLU_NON_SUPPORT_SCHEME);
    if(uerr) {
      result = urlerr_cvt(uerr);
      goto fail;
    }
    uerr = curl_url_get(uh, CURLUPART_PATH, &path, 0);
    if(uerr) {
      result = urlerr_cvt(uerr);
      goto fail;
    }
    uerr = curl_url_get(uh, CURLUPART_QUERY, &query, 0);
    if(!uerr && query) {
      curl_free(query);
      curl_free(path);
      curl_url_cleanup(uh);
      return CURLE_OK;
    }
    ptr = strrchr(path, '/');
    if(!ptr || !*++ptr) {
      /* The URL path has no filename part, add the local filename. In order
         to be able to do so, we have to create a new URL in another buffer.*/

      /* We only want the part of the local path that is on the right
         side of the rightmost slash and backslash. */
      const char *filep = strrchr(filename, '/');
      char *file2 = strrchr(filep ? filep : filename, '\\');
      char *encfile;

      if(file2)
        filep = file2 + 1;
      else if(filep)
        filep++;
      else
        filep = filename;

      /* URL encode the filename */
      encfile = curl_easy_escape(curl, filep, 0 /* use strlen */);
      if(encfile) {
        char *newpath;
        char *newurl;
        if(ptr)
          /* there is a trailing slash on the path */
          newpath = aprintf("%s%s", path, encfile);
        else
          /* there is no trailing slash on the path */
          newpath = aprintf("%s/%s", path, encfile);

        curl_free(encfile);

        if(!newpath)
          goto fail;
        uerr = curl_url_set(uh, CURLUPART_PATH, newpath, 0);
        free(newpath);
        if(uerr) {
          result = urlerr_cvt(uerr);
          goto fail;
        }
        uerr = curl_url_get(uh, CURLUPART_URL, &newurl, CURLU_DEFAULT_SCHEME);
        if(uerr) {
          result = urlerr_cvt(uerr);
          goto fail;
        }
        free(*inurlp);
        *inurlp = newurl;
        result = CURLE_OK;
      }
    }
    else
      /* nothing to do */
      result = CURLE_OK;
  }
fail:
  curl_url_cleanup(uh);
  curl_free(path);
  return result;
}